

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.h
# Opt level: O0

void __thiscall spvtools::opt::FoldingRules::FoldingRules(FoldingRules *this,IRContext *ctx)

{
  IRContext *ctx_local;
  FoldingRules *this_local;
  
  this->_vptr_FoldingRules = (_func_int **)&PTR__FoldingRules_013bd968;
  std::
  unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
  ::unordered_map(&this->rules_);
  std::
  map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
  ::map(&this->ext_rules_);
  this->context_ = ctx;
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::vector(&this->empty_vector_);
  return;
}

Assistant:

explicit FoldingRules(IRContext* ctx) : context_(ctx) {}